

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O2

int clip_to_short(int *x,int *y,int *w,int *h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar3 = 1;
  iVar2 = fl_line_width_;
  if (fl_line_width_ < 2) {
    iVar2 = 1;
  }
  iVar1 = *w;
  if ((0 < iVar1) && (0 < *h)) {
    iVar4 = -iVar2;
    iVar7 = *x;
    if ((SBORROW4(iVar7 + iVar1,iVar4) == iVar7 + iVar1 + iVar2 < 0) &&
       ((iVar5 = *y, iVar6 = *h + iVar5, SBORROW4(iVar6,iVar4) == iVar6 + iVar2 < 0 &&
        (iVar6 = 0x7fff - iVar2, iVar5 <= iVar6 && iVar7 <= iVar6)))) {
      if (SBORROW4(iVar7,iVar4) != iVar7 + iVar2 < 0) {
        *w = iVar1 + iVar2 + iVar7;
        *x = iVar4;
        iVar5 = *y;
        iVar7 = iVar4;
      }
      if (SBORROW4(iVar5,iVar4) != iVar5 + iVar2 < 0) {
        *h = *h + iVar5 + iVar2;
        *y = iVar4;
        iVar7 = *x;
        iVar5 = iVar4;
      }
      if (iVar6 < *w + iVar7) {
        *w = iVar6 - iVar7;
        iVar5 = *y;
      }
      iVar3 = 0;
      if (iVar6 < *h + iVar5) {
        *h = iVar6 - iVar5;
      }
    }
  }
  return iVar3;
}

Assistant:

static int clip_to_short(int &x, int &y, int &w, int &h) {

  int lw = (fl_line_width_ > 0) ? fl_line_width_ : 1;
  int kmin = -lw;
  int kmax = SHRT_MAX - lw;

  if (w <= 0 || h <= 0) return 1;		// (a)
  if (x+w < kmin || y+h < kmin) return 1;	// (b)
  if (x > kmax || y > kmax) return 1;		// (c)

  if (x < kmin) { w -= (kmin-x); x = kmin; }
  if (y < kmin) { h -= (kmin-y); y = kmin; }
  if (x+w > kmax) w = kmax - x;
  if (y+h > kmax) h = kmax - y;

  return 0;
}